

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

FSerializer * Serialize(FSerializer *arc,char *key,uint16_t *value,uint16_t *defval)

{
  uint32_t vv;
  uint32_t vvd;
  uint local_20;
  uint local_1c;
  
  local_20 = (uint)*value;
  if (defval == (uint16_t *)0x0) {
    local_1c = local_20 - 1;
  }
  else {
    local_1c = (uint)*defval;
  }
  Serialize(arc,key,&local_20,&local_1c);
  *value = (uint16_t)local_20;
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, uint16_t &value, uint16_t *defval)
{
	uint32_t vv = value;
	uint32_t vvd = defval ? *defval : value - 1;
	Serialize(arc, key, vv, &vvd);
	value = (uint16_t)vv;
	return arc;
}